

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

uint md_decode_utf8_before__(MD_CTX *ctx,MD_OFFSET off)

{
  MD_OFFSET off_local;
  MD_CTX *ctx_local;
  
  if (0x7f < (byte)ctx->text[off - 1]) {
    if (((1 < off) && ((ctx->text[off - 2] & 0xe0U) == 0xc0)) &&
       ((ctx->text[off - 1] & 0xc0U) == 0x80)) {
      return ((int)ctx->text[off - 2] & 0x1fU) << 6 | (int)ctx->text[off - 1] & 0x3fU;
    }
    if (((2 < off) && ((ctx->text[off - 3] & 0xf0U) == 0xe0)) &&
       (((ctx->text[off - 2] & 0xc0U) == 0x80 && ((ctx->text[off - 1] & 0xc0U) == 0x80)))) {
      return ((int)ctx->text[off - 3] & 0xfU) << 0xc | ((int)ctx->text[off - 2] & 0x3fU) << 6 |
             (int)ctx->text[off - 1] & 0x3fU;
    }
    if (((3 < off) && ((ctx->text[off - 4] & 0xf8U) == 0xf0)) &&
       (((ctx->text[off - 3] & 0xc0U) == 0x80 &&
        (((ctx->text[off - 2] & 0xc0U) == 0x80 && ((ctx->text[off - 1] & 0xc0U) == 0x80)))))) {
      return ((int)ctx->text[off - 4] & 7U) << 0x12 | ((int)ctx->text[off - 3] & 0x3fU) << 0xc |
             ((int)ctx->text[off - 2] & 0x3fU) << 6 | (int)ctx->text[off - 1] & 0x3fU;
    }
  }
  return (int)ctx->text[off - 1];
}

Assistant:

static unsigned
    md_decode_utf8_before__(MD_CTX* ctx, OFF off)
    {
        if(!IS_UTF8_LEAD1(CH(off-1))) {
            if(off > 1 && IS_UTF8_LEAD2(CH(off-2)) && IS_UTF8_TAIL(CH(off-1)))
                return (((unsigned int)CH(off-2) & 0x1f) << 6) |
                       (((unsigned int)CH(off-1) & 0x3f) << 0);

            if(off > 2 && IS_UTF8_LEAD3(CH(off-3)) && IS_UTF8_TAIL(CH(off-2)) && IS_UTF8_TAIL(CH(off-1)))
                return (((unsigned int)CH(off-3) & 0x0f) << 12) |
                       (((unsigned int)CH(off-2) & 0x3f) << 6) |
                       (((unsigned int)CH(off-1) & 0x3f) << 0);

            if(off > 3 && IS_UTF8_LEAD4(CH(off-4)) && IS_UTF8_TAIL(CH(off-3)) && IS_UTF8_TAIL(CH(off-2)) && IS_UTF8_TAIL(CH(off-1)))
                return (((unsigned int)CH(off-4) & 0x07) << 18) |
                       (((unsigned int)CH(off-3) & 0x3f) << 12) |
                       (((unsigned int)CH(off-2) & 0x3f) << 6) |
                       (((unsigned int)CH(off-1) & 0x3f) << 0);
        }

        return (unsigned) CH(off-1);
    }